

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O3

void __thiscall Refal2::CScanner::preprocessingPlusAfterLineFeed(CScanner *this,char c)

{
  undefined8 uVar1;
  int iVar2;
  undefined7 in_register_00000031;
  
  iVar2 = (int)CONCAT71(in_register_00000031,c);
  if (iVar2 < 0x2a) {
    if ((iVar2 - 9U < 2) || (iVar2 == 0x20)) {
      return;
    }
LAB_001313cc:
    this->preprocessingState = PS_Initial;
    preprocessing(this,c);
    return;
  }
  if (iVar2 == 0x2a) {
    uVar1 = 0x200000003;
  }
  else {
    if (iVar2 != 0x7b) {
      if (iVar2 == 0x3b) {
        warning(this,W_Semicolon,';');
        return;
      }
      goto LAB_001313cc;
    }
    uVar1 = 0x200000004;
  }
  this->preprocessingState = (int)uVar1;
  this->savedPreprocessingState = (int)((ulong)uVar1 >> 0x20);
  return;
}

Assistant:

void CScanner::preprocessingPlusAfterLineFeed( char c )
{
	switch( c ) {
		case Semicolon:
			warning( W_Semicolon, c );
			break;
		case LineFeed:
			break;
		case SingleLineCommentBegin:
			savedPreprocessingState = PS_PlusAfterLineFeed;
			preprocessingState = PS_SingleLineComment;
			break;
		case MultilineCommentBegin:
			savedPreprocessingState = PS_PlusAfterLineFeed;
			preprocessingState = PS_MultilineComment;
			break;
		default:
			if( !IsSpace( c ) ) {
				preprocessingState = PS_Initial;
				preprocessing( c );
			}
			break;
	}
}